

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

void __thiscall google::protobuf::ServiceDescriptorProto::Clear(ServiceDescriptorProto *this)

{
  bool bVar1;
  UnknownFieldSet *this_00;
  ServiceDescriptorProto *this_local;
  
  if ((this->_has_bits_[0] & 0xff) != 0) {
    bVar1 = has_name(this);
    if ((bVar1) && (this->name_ != (string *)internal::kEmptyString_abi_cxx11_)) {
      std::__cxx11::string::clear();
    }
    bVar1 = has_options(this);
    if ((bVar1) && (this->options_ != (ServiceOptions *)0x0)) {
      ServiceOptions::Clear(this->options_);
    }
  }
  RepeatedPtrField<google::protobuf::MethodDescriptorProto>::Clear(&this->method_);
  memset(this->_has_bits_,0,4);
  this_00 = mutable_unknown_fields(this);
  UnknownFieldSet::Clear(this_00);
  return;
}

Assistant:

void ServiceDescriptorProto::Clear() {
  if (_has_bits_[0 / 32] & (0xffu << (0 % 32))) {
    if (has_name()) {
      if (name_ != &::google::protobuf::internal::kEmptyString) {
        name_->clear();
      }
    }
    if (has_options()) {
      if (options_ != NULL) options_->::google::protobuf::ServiceOptions::Clear();
    }
  }
  method_.Clear();
  ::memset(_has_bits_, 0, sizeof(_has_bits_));
  mutable_unknown_fields()->Clear();
}